

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O1

void __thiscall
GslSpan_FromContainerConstructor_Test::~GslSpan_FromContainerConstructor_Test
          (GslSpan_FromContainerConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromContainerConstructor) {
    std::vector<int> v = {1, 2, 3};
    std::vector<int> const cv = v;

    {
        span<int> s{v};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        span<const int> cs{v};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (cs.data (), v.data ());
    }

#if 0
    std::string str = "hello";
    std::string const cstr = "hello";

    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{str};
        EXPECT_EQ (s.size() == narrow_cast<std::ptrdiff_t>(str.size()) && s.data(), str.data());
#    endif
        span<char const > cs{str};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(str.size()));
        EXPECT_EQ (cs.data(), str.data());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        span<char> s{cstr};
#    endif
        span<const char> cs{cstr};
        EXPECT_EQ (cs.size(), static_cast<std::ptrdiff_t>(cstr.size()));
        EXPECT_EQ (cs.data(), cstr.data());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int> s) { static_cast<void> (s); };
        use_span (get_temp_vector ());
#endif
    }
    {
        auto get_temp_vector = [] () -> std::vector<int> { return {}; };
        auto use_span = [] (span<int const> s) { static_cast<void> (s); };
        use_span (span<int const> (get_temp_vector ()));
    }
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_string = [] () -> std::string { return {}; };
        auto use_span = [] (span<char> s) { static_cast<void> (s); };
        use_span (get_temp_string ());
#endif
    }
#if 0
    {
        auto get_temp_string = []() -> std::string { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
    {
#    ifdef CONFIRM_COMPILATION_ERRORS
        auto get_temp_vector = []() -> const std::vector<int> { return {}; };
        auto use_span = [](span<const char> s) { static_cast<void>(s); };
        use_span(get_temp_vector());
#    endif
    }
    {
        auto get_temp_string = []() -> std::string const { return {}; };
        auto use_span = [](span<char const> s) { static_cast<void>(s); };
        use_span(get_temp_string());
    }
#endif
    {
#ifdef CONFIRM_COMPILATION_ERRORS
        std::map<int, int> m;
        span<int> s{m};
#endif
    }
    {
        auto s = make_span (v);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (v.size ()));
        EXPECT_EQ (s.data (), v.data ());

        auto cs = make_span (cv);
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (cv.size ()));
        EXPECT_EQ (cs.data (), cv.data ());
    }
}